

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transmesh.c
# Opt level: O0

int main(int ArgCnt,char **ArgVec)

{
  int iVar1;
  uint uVar2;
  void *pvVar3;
  long lVar4;
  long in_RSI;
  int in_EDI;
  bool bVar5;
  char *TmpStr3;
  char *TmpStr2;
  char *TmpStr;
  char *MshNam [1024];
  int TokTab2 [1024];
  int TokTab [1024];
  int NmbTok2;
  int NmbTok;
  double d;
  float f;
  GrpSct *grp;
  GrpSct GrpTab [1024];
  char *FlgTab;
  char *PtrArg;
  char *OutNam;
  char *InpNam;
  int64_t OutIdx;
  int64_t InpIdx;
  int64_t NmbLin;
  int NmbNod;
  int deg;
  int pos;
  int NmbGrp;
  int ArgIdx;
  int MaxRef;
  int dim;
  int j;
  int i;
  int OutVer;
  int InpVer;
  int FilVer;
  int TypTab [1000];
  int SolSiz;
  int NmbTyp;
  char *in_stack_ffffffffffff2f88;
  undefined4 uVar6;
  undefined4 in_stack_ffffffffffff2f90;
  int in_stack_ffffffffffff2f94;
  undefined4 in_stack_ffffffffffff2f98;
  undefined2 in_stack_ffffffffffff2f9c;
  undefined1 in_stack_ffffffffffff2f9e;
  undefined1 in_stack_ffffffffffff2f9f;
  char *local_d060;
  char *local_d058;
  char *local_d050 [35];
  int in_stack_ffffffffffff30cc;
  int64_t in_stack_ffffffffffff30d0;
  int64_t in_stack_ffffffffffff30d8;
  int local_b048 [1024];
  int aiStack_a048 [1024];
  int local_9048;
  uint local_9044;
  uint *local_9030;
  uint local_9028 [4];
  int aiStack_9018 [2];
  undefined8 auStack_9010 [4094];
  void *local_1020;
  char *local_1018;
  char *local_1010;
  char *local_1008;
  int64_t local_1000;
  int64_t local_ff8;
  int64_t local_ff0;
  undefined4 local_fe8;
  uint local_fe4;
  int local_fe0;
  int local_fdc;
  int local_fd8;
  int local_fd4;
  uint local_fd0;
  int local_fcc;
  uint local_fc8;
  uint local_fc4;
  uint local_fc0;
  uint local_fbc;
  undefined1 local_fb8 [4000];
  undefined1 local_18 [4];
  uint local_14;
  long local_10;
  int local_8;
  int local_4;
  
  local_4 = 0;
  local_fbc = 0;
  local_fc4 = 1;
  local_fd8 = 1;
  local_fdc = 0;
  if (in_EDI == 1) {
    puts("\nTRANSMESH v5.2, july 19 2017, Loic MARECHAL / INRIA\n");
    puts(" Usage    : transmesh source_name destination_name (-options)\n");
    puts(" optional : -v output_file_version");
    puts(" version 1: 32 bits integers, 32 bits reals, file size < 2 GigaBytes");
    puts(" version 2: 32 bits integers, 64 bits reals, file size < 2 GigaBytes");
    puts(" version 3: 32 bits integers, 64 bits reals, file size < 8 ExaBytes");
    puts(" version 4: 64 bits integers, 64 bits reals, file size < 8 ExaBytes\n");
    puts(" optional : -igroup inflow 1 Triangles 3,5,6,9-14");
    puts("            Defines a group named \"inflow\" with index 1 that includes");
    puts("            a set of comma-seprated triangle references.");
    puts("            You may also specify ranges between two dash-separated indices.\n");
    puts(" optional : -egroup wings 3 Quadrilaterals 6-20");
    puts("            Defines a group named \"wings\" with index 3 that excludes");
    puts("            a set of comma-seprated quadrilateral references.");
    puts("            You may also specify ranges between two dash-separated indices.\n");
    exit(0);
  }
  local_1008 = *(char **)(in_RSI + 8);
  local_fd8 = 3;
  local_1010 = *(char **)(in_RSI + 0x10);
  local_10 = in_RSI;
  local_8 = in_EDI;
  iVar1 = strcmp(local_1008,local_1010);
  if (iVar1 == 0) {
    puts("The output mesh cannot overwrite the input mesh.");
    exit(1);
  }
  memset(GmfMaxRefTab,0,0x3c4);
  while (local_fd8 < local_8) {
    local_1018 = *(char **)(local_10 + (long)local_fd8 * 8);
    local_fd8 = local_fd8 + 1;
    iVar1 = strcmp(local_1018,"-v");
    if (iVar1 == 0) {
      lVar4 = (long)local_fd8;
      local_fd8 = local_fd8 + 1;
      local_fbc = atoi(*(char **)(local_10 + lVar4 * 8));
      if (((int)local_fbc < 1) || (4 < (int)local_fbc)) {
        printf("Wrong size type : %d\n",(ulong)local_fbc);
        exit(1);
      }
    }
    iVar1 = strcmp(local_1018,"-igroup");
    if ((iVar1 == 0) || (iVar1 = strcmp(local_1018,"-egroup"), iVar1 == 0)) {
      local_9030 = local_9028 + (long)local_fdc * 8;
      iVar1 = local_fd8 + 1;
      auStack_9010[(long)local_fdc * 4] = *(undefined8 *)(local_10 + (long)local_fd8 * 8);
      local_fd8 = local_fd8 + 2;
      local_fdc = local_fdc + 1;
      uVar2 = atoi(*(char **)(local_10 + (long)iVar1 * 8));
      *local_9030 = uVar2;
      local_fd8 = local_fd8 + 1;
      uVar2 = GetKwdIdx(in_stack_ffffffffffff2f88);
      local_9030[4] = uVar2;
      local_9030[1] = 0;
      local_9044 = 0;
      local_d050[0] = *(char **)(local_10 + (long)local_fd8 * 8);
      local_fd8 = local_fd8 + 1;
      while( true ) {
        in_stack_ffffffffffff2f9f = false;
        if ((int)local_9044 < 0x400) {
          local_d058 = strsep(local_d050,",");
          in_stack_ffffffffffff2f9f = local_d058 != (char *)0x0;
        }
        if ((bool)in_stack_ffffffffffff2f9f == false) break;
        local_9048 = 0;
        while( true ) {
          bVar5 = false;
          if (local_9048 < 2) {
            local_d060 = strsep(&local_d058,"-");
            bVar5 = local_d060 != (char *)0x0;
          }
          if (!bVar5) break;
          iVar1 = atoi(local_d060);
          local_b048[local_9048] = iVar1;
          local_9048 = local_9048 + 1;
        }
        if (local_9048 == 1) {
          aiStack_a048[(int)local_9044] = local_b048[0];
          local_9044 = local_9044 + 1;
        }
        else {
          if (local_9048 != 2) {
            exit(1);
          }
          for (local_fc8 = local_b048[0]; (int)local_fc8 <= local_b048[1]; local_fc8 = local_fc8 + 1
              ) {
            aiStack_a048[(int)local_9044] = local_fc8;
            local_9044 = local_9044 + 1;
          }
        }
        in_stack_ffffffffffff2f9e = 0;
      }
      local_9030[1] = local_9044;
      pvVar3 = malloc((long)(int)local_9030[1] << 2);
      *(void **)(local_9030 + 2) = pvVar3;
      for (local_fc8 = 0; (int)local_fc8 < (int)local_9030[1]; local_fc8 = local_fc8 + 1) {
        *(int *)(*(long *)(local_9030 + 2) + (long)(int)local_fc8 * 4) =
             aiStack_a048[(int)local_fc8];
      }
      iVar1 = strcmp(local_1018,"-igroup");
      if (iVar1 == 0) {
        local_9030[5] = 1;
      }
      else {
        local_9030[5] = 0xffffffff;
      }
    }
  }
  local_ff8 = GmfOpenMesh(local_1008,1,&local_fc0,&local_fd0);
  if (local_ff8 == 0) {
    fprintf(_stderr,"Source of error : TRANSMESH / OPEN_MESH\n");
    fprintf(_stderr,"Cannot open %s\n",local_1008);
    local_4 = 1;
  }
  else {
    if (local_fbc == 0) {
      local_fc4 = local_fc0;
    }
    else {
      local_fc4 = local_fbc;
    }
    local_1000 = GmfOpenMesh(local_1010,2,(ulong)local_fc4,(ulong)local_fd0);
    if (local_1000 == 0) {
      fprintf(_stderr,"Source of error : TRANSMESH / OPEN_MESH\n");
      fprintf(_stderr,"Cannot open %s\n",local_1010);
      local_4 = 1;
    }
    else {
      for (local_fc8 = 0; (int)local_fc8 < 0xf1; local_fc8 = local_fc8 + 1) {
        iVar1 = strcmp(GmfKwdFmt[(int)local_fc8][0],"Reserved");
        if (((iVar1 != 0) && (iVar1 = strcmp(GmfKwdFmt[(int)local_fc8][0],"End"), iVar1 != 0)) &&
           (iVar1 = GmfGotoKwd(CONCAT17(in_stack_ffffffffffff2f9f,
                                        CONCAT16(in_stack_ffffffffffff2f9e,
                                                 CONCAT24(in_stack_ffffffffffff2f9c,
                                                          in_stack_ffffffffffff2f98))),
                               in_stack_ffffffffffff2f94), iVar1 != 0)) {
          iVar1 = strcmp("i",GmfKwdFmt[(int)local_fc8][1]);
          if (iVar1 == 0) {
            iVar1 = strcmp("sr",GmfKwdFmt[(int)local_fc8][2]);
            if ((iVar1 == 0) || (iVar1 = strcmp("hr",GmfKwdFmt[(int)local_fc8][2]), iVar1 == 0)) {
              iVar1 = strcmp("sr",GmfKwdFmt[(int)local_fc8][2]);
              if (iVar1 == 0) {
                local_ff0 = GmfStatKwd(local_ff8,(int)(ulong)local_fc8,&local_14,local_18,local_fb8)
                ;
                if (local_ff0 == 0) goto LAB_00106e0f;
                GmfSetKwd(local_1000,(int)(ulong)local_fc8,local_ff0,(ulong)local_14,local_fb8);
              }
              else {
                iVar1 = strcmp("hr",GmfKwdFmt[(int)local_fc8][2]);
                if (iVar1 == 0) {
                  in_stack_ffffffffffff2f88 = (char *)&local_fe8;
                  local_ff0 = GmfStatKwd(local_ff8,(int)(ulong)local_fc8,&local_14,local_18,
                                         local_fb8,&local_fe4,in_stack_ffffffffffff2f88);
                  if (local_ff0 == 0) goto LAB_00106e0f;
                  in_stack_ffffffffffff2f88 =
                       (char *)CONCAT44((int)((ulong)in_stack_ffffffffffff2f88 >> 0x20),local_fe8);
                  GmfSetKwd(local_1000,(int)(ulong)local_fc8,local_ff0,(ulong)local_14,local_fb8,
                            (ulong)local_fe4,in_stack_ffffffffffff2f88);
                }
              }
            }
            else {
              local_ff0 = GmfStatKwd(local_ff8,(int)(ulong)local_fc8);
              if (local_ff0 == 0) goto LAB_00106e0f;
              GmfSetKwd(local_1000,(int)(ulong)local_fc8,local_ff0);
            }
          }
          else {
            local_ff0 = GmfStatKwd(local_ff8,(int)(ulong)local_fc8);
            if (local_ff0 == 0) goto LAB_00106e0f;
            GmfSetKwd(local_1000,(int)(ulong)local_fc8,0);
          }
          printf("Parsing %s : %ld item\n",GmfKwdFmt[(int)local_fc8][0],local_ff0);
          for (local_fcc = 1; local_fcc <= local_ff0; local_fcc = local_fcc + 1) {
            GmfCpyLin(in_stack_ffffffffffff30d8,in_stack_ffffffffffff30d0,in_stack_ffffffffffff30cc)
            ;
          }
        }
LAB_00106e0f:
      }
      if (local_fdc != 0) {
        GmfSetKwd(local_1000,0x5e,(long)local_fdc);
        local_fe0 = 1;
        for (local_fc8 = 0; uVar6 = (undefined4)((ulong)in_stack_ffffffffffff2f88 >> 0x20),
            (int)local_fc8 < local_fdc; local_fc8 = local_fc8 + 1) {
          lVar4 = (long)(int)local_fc8;
          local_9030 = local_9028 + lVar4 * 8;
          if (aiStack_9018[lVar4 * 8 + 1] == -1) {
            if (GmfMaxRefTab[aiStack_9018[lVar4 * 8]] == 0) {
              local_fd4 = 0x400;
            }
            else {
              local_fd4 = GmfMaxRefTab[aiStack_9018[lVar4 * 8]];
            }
            local_1020 = malloc((long)(local_fd4 + 1));
            for (local_fc8 = 1; (int)local_fc8 <= local_fd4; local_fc8 = local_fc8 + 1) {
              *(undefined1 *)((long)local_1020 + (long)(int)local_fc8) = 1;
            }
            for (local_fc8 = 0; (int)local_fc8 < (int)local_9030[1]; local_fc8 = local_fc8 + 1) {
              *(undefined1 *)
               ((long)local_1020 +
               (long)*(int *)(*(long *)(local_9030 + 2) + (long)(int)local_fc8 * 4)) = 0;
            }
            free(*(void **)(local_9030 + 2));
            local_9030[1] = local_fd4 - local_9030[1];
            pvVar3 = malloc((long)(int)local_9030[1] << 2);
            *(void **)(local_9030 + 2) = pvVar3;
            local_fe0 = 0;
            for (local_fc8 = 1; (int)local_fc8 <= local_fd4; local_fc8 = local_fc8 + 1) {
              if (*(char *)((long)local_1020 + (long)(int)local_fc8) != '\0') {
                *(uint *)(*(long *)(local_9030 + 2) + (long)local_fe0 * 4) = local_fc8;
                local_fe0 = local_fe0 + 1;
              }
            }
            free(local_1020);
          }
          in_stack_ffffffffffff2f88 = (char *)CONCAT44(uVar6,local_fe0);
          GmfSetLin(local_1000,0x5e,*(undefined8 *)(local_9030 + 6),(ulong)*local_9030,
                    (ulong)local_9030[4],(ulong)local_9030[1],in_stack_ffffffffffff2f88);
          local_fe0 = local_9030[1] + local_fe0;
        }
        GmfSetKwd(local_1000,0x5f,(long)(local_fe0 + -1));
        for (local_fc8 = 0; (int)local_fc8 < local_fdc; local_fc8 = local_fc8 + 1) {
          local_9030 = local_9028 + (long)(int)local_fc8 * 8;
          for (local_fcc = 0; local_fcc < (int)local_9030[1]; local_fcc = local_fcc + 1) {
            GmfSetLin(local_1000,0x5f,(ulong)local_9030[4],
                      (ulong)*(uint *)(*(long *)(local_9030 + 2) + (long)local_fcc * 4),
                      (ulong)*local_9030);
          }
        }
      }
      iVar1 = GmfCloseMesh(CONCAT44(in_stack_ffffffffffff2f94,in_stack_ffffffffffff2f90));
      if (iVar1 == 0) {
        local_4 = 1;
      }
      else {
        iVar1 = GmfCloseMesh(CONCAT44(in_stack_ffffffffffff2f94,in_stack_ffffffffffff2f90));
        if (iVar1 == 0) {
          local_4 = 1;
        }
        else {
          local_4 = 0;
        }
      }
    }
  }
  return local_4;
}

Assistant:

int main(int ArgCnt, char **ArgVec)
{
   int      NmbTyp, SolSiz, TypTab[ GmfMaxTyp ], FilVer = 0, InpVer, OutVer = 1;
   int      i, j, dim, MaxRef, ArgIdx = 1, NmbGrp = 0, pos, deg, NmbNod;
   int64_t  NmbLin, InpIdx, OutIdx;
   char     *InpNam, *OutNam, *PtrArg, *FlgTab;
   GrpSct   GrpTab[ MaxGrp ], *grp;
#ifndef WIN32
   float    f;
   double   d;
   int      NmbTok, NmbTok2, TokTab[ MaxTok ], TokTab2[ MaxTok ];
   char     *MshNam[ StrSiz ], *TmpStr, *TmpStr2, *TmpStr3;
#endif

   if(ArgCnt == 1)
   {
      puts("\nTRANSMESH v5.2, july 19 2017, Loic MARECHAL / INRIA\n");
      puts(" Usage    : transmesh source_name destination_name (-options)\n");
      puts(" optional : -v output_file_version");
      puts(" version 1: 32 bits integers, 32 bits reals, file size < 2 GigaBytes");
      puts(" version 2: 32 bits integers, 64 bits reals, file size < 2 GigaBytes");
      puts(" version 3: 32 bits integers, 64 bits reals, file size < 8 ExaBytes");
      puts(" version 4: 64 bits integers, 64 bits reals, file size < 8 ExaBytes\n");
#ifndef WIN32
      puts(" optional : -igroup inflow 1 Triangles 3,5,6,9-14");
      puts("            Defines a group named \"inflow\" with index 1 that includes");
      puts("            a set of comma-seprated triangle references.");
      puts("            You may also specify ranges between two dash-separated indices.\n");
      puts(" optional : -egroup wings 3 Quadrilaterals 6-20");
      puts("            Defines a group named \"wings\" with index 3 that excludes");
      puts("            a set of comma-seprated quadrilateral references.");
      puts("            You may also specify ranges between two dash-separated indices.\n");
#endif
      exit(0);
   }

   InpNam = ArgVec[ ArgIdx++ ];
   OutNam = ArgVec[ ArgIdx++ ];

   if(!strcmp(InpNam, OutNam))
   {
      puts("The output mesh cannot overwrite the input mesh.");
      exit(1);
   }

   memset(GmfMaxRefTab, 0, (GmfMaxKwd + 1) * sizeof(int));

   while(ArgIdx < ArgCnt)
   {
      PtrArg = ArgVec[ ArgIdx++ ];

      if(!strcmp(PtrArg, "-v"))
      {
         FilVer = atoi(ArgVec[ ArgIdx++ ]);

         if( (FilVer < 1) || (FilVer > 4) )
         {
            printf("Wrong size type : %d\n", FilVer);
            exit(1);
         }
      }
#ifndef WIN32
      if(!strcmp(PtrArg, "-igroup") || !strcmp(PtrArg, "-egroup"))
      {
         grp = &GrpTab[ NmbGrp++ ];
         grp->NfoStr = ArgVec[ ArgIdx++ ];
         grp->idx = atoi(ArgVec[ ArgIdx++ ]);
         grp->typ = GetKwdIdx(ArgVec[ ArgIdx++ ]);
         grp->NmbRef = 0;
         NmbTok = 0;
         TmpStr = ArgVec[ ArgIdx++ ];

         while( (NmbTok < MaxTok) && ((TmpStr2 = strsep(&TmpStr, ","))) )
         {
            NmbTok2 = 0;

            while( (NmbTok2 < 2) && ((TmpStr3 = strsep(&TmpStr2, "-"))) )
               TokTab2[ NmbTok2++ ] = atoi(TmpStr3);

            if(NmbTok2 == 1)
               TokTab[ NmbTok++ ] = TokTab2[0];
            else if(NmbTok2 == 2)
               for(i=TokTab2[0]; i<=TokTab2[1]; i++)
                  TokTab[ NmbTok++ ] = i;
            else
               exit(1);
         }

         grp->NmbRef = NmbTok;
         grp->RefTab = malloc(grp->NmbRef * sizeof(int));

         for(i=0;i<grp->NmbRef;i++)
            grp->RefTab[i] = TokTab[i];

         if(!strcmp(PtrArg, "-igroup"))
            grp->sgn = 1;
         else
            grp->sgn = -1;
      }
#endif
   }

   if(!(InpIdx = GmfOpenMesh(InpNam, GmfRead, &InpVer, &dim)))
   {
      fprintf(stderr,"Source of error : TRANSMESH / OPEN_MESH\n");
      fprintf(stderr,"Cannot open %s\n", InpNam);
      return(1);
   }

   if(FilVer)
      OutVer = FilVer;
   else
      OutVer = InpVer;

   if(!(OutIdx = GmfOpenMesh(OutNam, GmfWrite, OutVer, dim)))
   {
      fprintf(stderr,"Source of error : TRANSMESH / OPEN_MESH\n");
      fprintf(stderr,"Cannot open %s\n", OutNam);
      return(1);
   }

   for(i=0;i<=GmfMaxKwd;i++)
   {
      if(!strcmp(GmfKwdFmt[i][0], "Reserved") || !strcmp(GmfKwdFmt[i][0], "End"))
         continue;

      if(!GmfGotoKwd(InpIdx, i))
         continue;

      if(strcmp("i", GmfKwdFmt[i][1]))
      {
         if((NmbLin = GmfStatKwd(InpIdx, i)))
            GmfSetKwd(OutIdx, i, 0);
         else
            continue;
      }
      else if(strcmp("sr", GmfKwdFmt[i][2]) && strcmp("hr", GmfKwdFmt[i][2]))
      {
         if((NmbLin = GmfStatKwd(InpIdx, i)))
            GmfSetKwd(OutIdx, i, NmbLin);
         else
            continue;
      }
      else
      {
         if(!strcmp("sr", GmfKwdFmt[i][2]))
         {
            if((NmbLin = GmfStatKwd(InpIdx, i, &NmbTyp, &SolSiz, TypTab)))
               GmfSetKwd(OutIdx, i,  NmbLin, NmbTyp, TypTab);
            else
               continue;
         }
         else if(!strcmp("hr", GmfKwdFmt[i][2]))
         {
            if((NmbLin = GmfStatKwd(InpIdx, i, &NmbTyp, &SolSiz, TypTab, &deg, &NmbNod)))
               GmfSetKwd(OutIdx, i,  NmbLin, NmbTyp, TypTab, deg, NmbNod);
            else
               continue;
         }
      }

      printf("Parsing %s : "INT64_T_FMT" item\n", GmfKwdFmt[i][0], NmbLin);

      for(j=1;j<=NmbLin;j++)
         GmfCpyLin(InpIdx, OutIdx, i);
   }

   if(NmbGrp)
   {
      GmfSetKwd(OutIdx, GmfIRefGroups, NmbGrp);
      pos = 1;

      for(i=0;i<NmbGrp;i++)
      {
         grp = &GrpTab[i];

         if(grp->sgn == -1)
         {
            MaxRef = GmfMaxRefTab[ grp->typ ] ? GmfMaxRefTab[ grp->typ ] : DefMaxRef;
            FlgTab = malloc(MaxRef+1);

            for(i=1;i<=MaxRef;i++)
               FlgTab[i] = 1;

            for(i=0;i<grp->NmbRef;i++)
               FlgTab[ grp->RefTab[i] ] = 0;

            free(grp->RefTab);
            grp->NmbRef = MaxRef - grp->NmbRef;
            grp->RefTab = malloc(grp->NmbRef * sizeof(int));
            pos = 0;

            for(i=1;i<=MaxRef;i++)
               if(FlgTab[i])
                  grp->RefTab[ pos++ ] = i;

            free(FlgTab);
         }

         GmfSetLin(OutIdx, GmfIRefGroups, grp->NfoStr, grp->idx, grp->typ, grp->NmbRef, pos);
         pos += grp->NmbRef;
      }

      GmfSetKwd(OutIdx, GmfDRefGroups, pos - 1);

      for(i=0;i<NmbGrp;i++)
      {
         grp = &GrpTab[i];

         for(j=0;j<grp->NmbRef;j++)
            GmfSetLin(OutIdx, GmfDRefGroups, grp->typ, grp->RefTab[j], grp->idx);
      }
   }

   if(!GmfCloseMesh(InpIdx))
      return(1);

   if(!GmfCloseMesh(OutIdx))
      return(1);

   return(0);
}